

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRenderRule * __thiscall QRenderRule::operator=(QRenderRule *this,QRenderRule *param_1)

{
  undefined4 uVar1;
  undefined7 uVar2;
  QBrush QVar3;
  undefined7 uVar4;
  QFont QVar5;
  QPainterPath QVar6;
  
  this->features = param_1->features;
  QVar3 = this->defaultBackground;
  uVar4 = *(undefined7 *)&this->field_0x9;
  uVar2 = *(undefined7 *)&param_1->field_0x9;
  this->defaultBackground = param_1->defaultBackground;
  *(undefined7 *)&this->field_0x9 = uVar2;
  param_1->defaultBackground = QVar3;
  *(undefined7 *)&param_1->field_0x9 = uVar4;
  QVar5 = this->font;
  uVar4 = *(undefined7 *)&this->field_0x11;
  uVar2 = *(undefined7 *)&param_1->field_0x11;
  this->font = param_1->font;
  *(undefined7 *)&this->field_0x11 = uVar2;
  param_1->font = QVar5;
  *(undefined7 *)&param_1->field_0x11 = uVar4;
  uVar1 = *(undefined4 *)&this->field_0x18;
  *(undefined4 *)&this->field_0x18 = *(undefined4 *)&param_1->field_0x18;
  *(undefined4 *)&param_1->field_0x18 = uVar1;
  this->hasFont = param_1->hasFont;
  QHash<QString,_QVariant>::operator=(&this->styleHints,&param_1->styleHints);
  QSharedDataPointer<QStyleSheetPaletteData>::operator=(&this->pal,&param_1->pal);
  QSharedDataPointer<QStyleSheetBoxData>::operator=(&this->b,&param_1->b);
  QSharedDataPointer<QStyleSheetBackgroundData>::operator=(&this->bg,&param_1->bg);
  QSharedDataPointer<QStyleSheetBorderData>::operator=(&this->bd,&param_1->bd);
  QSharedDataPointer<QStyleSheetOutlineData>::operator=(&this->ou,&param_1->ou);
  QSharedDataPointer<QStyleSheetGeometryData>::operator=(&this->geo,&param_1->geo);
  QSharedDataPointer<QStyleSheetPositionData>::operator=(&this->p,&param_1->p);
  QSharedDataPointer<QStyleSheetImageData>::operator=(&this->img,&param_1->img);
  QSharedDataPointer<QStyleSheetImageData>::operator=(&this->iconPtr,&param_1->iconPtr);
  this->clipset = param_1->clipset;
  QVar6 = this->clipPath;
  uVar4 = *(undefined7 *)&this->field_0x81;
  uVar2 = *(undefined7 *)&param_1->field_0x81;
  this->clipPath = param_1->clipPath;
  *(undefined7 *)&this->field_0x81 = uVar2;
  param_1->clipPath = QVar6;
  *(undefined7 *)&param_1->field_0x81 = uVar4;
  return this;
}

Assistant:

QRenderRule() : features(0), hasFont(false), pal(nullptr), b(nullptr), bg(nullptr), bd(nullptr), ou(nullptr), geo(nullptr), p(nullptr), img(nullptr), clipset(0) { }